

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

int __thiscall vm::VM::init(VM *this,EVP_PKEY_CTX *ctx)

{
  pointer ppVar1;
  int extraout_EAX;
  
  this->prepared = false;
  this->_sp = 0;
  this->_bp = 0;
  this->_ip = 0;
  this->_counterInstruction = 0;
  std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::_M_erase_at_end
            (&this->_contexts,
             (this->_contexts).super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>
             ._M_impl.super__Vector_impl_data._M_start);
  ppVar1 = (this->_heapRecord).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_heapRecord).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar1) {
    (this->_heapRecord).
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar1;
  }
  std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_int>,_std::allocator<std::pair<const_unsigned_short,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->_stringLiteralPool)._M_h);
  return extraout_EAX;
}

Assistant:

void VM::init() noexcept {
    prepared = false;
    _sp = 0;
    _bp = 0;
    _ip = 0;
    _counterInstruction = 0;
    _contexts.clear();
    _heapRecord.clear();
    _stringLiteralPool.clear();
}